

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Add(RepeatedField<unsigned_int> *this,uint *value)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *in_RSI;
  uint *in_RDI;
  uint tmp;
  uint32 size;
  RepeatedField<unsigned_int> *in_stack_00000040;
  int in_stack_000000dc;
  RepeatedField<unsigned_int> *in_stack_000000e0;
  
  uVar1 = *in_RDI;
  if (uVar1 == in_RDI[1]) {
    uVar2 = *in_RSI;
    Reserve(in_stack_000000e0,in_stack_000000dc);
    puVar3 = elements(in_stack_00000040);
    puVar3[uVar1] = uVar2;
  }
  else {
    uVar2 = *in_RSI;
    puVar3 = elements(in_stack_00000040);
    puVar3[uVar1] = uVar2;
  }
  *in_RDI = uVar1 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32 size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}